

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

Literal * fromBinaryenLiteral(BinaryenLiteral x)

{
  char *__s;
  bool bVar1;
  IString *this;
  undefined1 in_CL;
  uint uVar2;
  Literal *in_RDI;
  string_view sVar3;
  ulong in_stack_00000008;
  undefined1 local_38 [8];
  HeapType heapType;
  Type local_20;
  Type type;
  
  if (6 < in_stack_00000008) {
switchD_005b6fbc_default:
    bVar1 = wasm::Type::isRef(&local_20);
    if (!bVar1) {
      __assert_fail("type.isRef()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                    ,0x82,"Literal fromBinaryenLiteral(BinaryenLiteral)");
    }
    local_38 = (undefined1  [8])wasm::Type::getHeapType(&local_20);
    if ((ulong)local_38 < 0xe) {
      uVar2 = SUB84(local_38,0) - 0xb;
      in_CL = (undefined1)uVar2;
      if (uVar2 < 3) {
        bVar1 = wasm::Type::isNullable(&local_20);
        if (bVar1) {
          wasm::Literal::makeNull(in_RDI,(HeapType)local_38);
          return in_RDI;
        }
        __assert_fail("type.isNullable()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                      ,0x98,"Literal fromBinaryenLiteral(BinaryenLiteral)");
      }
      switch((ulong)local_38 & 0xffffffff) {
      case 0:
      case 2:
        wasm::handle_unreachable
                  ("TODO: extern literals",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                   ,0x8a);
      case 1:
      case 3:
      case 5:
      case 6:
        wasm::handle_unreachable
                  ("invalid type",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                   ,0x8f);
      case 4:
        wasm::handle_unreachable
                  ("TODO: i31",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                   ,0x87);
      case 7:
      case 8:
      case 9:
      case 10:
        wasm::handle_unreachable
                  ("TODO: string literals",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                   ,0x94);
      }
    }
    bVar1 = wasm::HeapType::isSignature((HeapType *)local_38);
    if (bVar1) {
      __s = (char *)CONCAT44(x.type._4_4_,(int32_t)x.type);
      this = (IString *)strlen(__s);
      sVar3._M_str = (char *)0x0;
      sVar3._M_len = (size_t)__s;
      sVar3 = wasm::IString::interned(this,sVar3,(bool)in_CL);
      wasm::Literal::Literal(in_RDI,(Name)sVar3,(HeapType)local_38);
      return in_RDI;
    }
    bVar1 = wasm::HeapType::isData((HeapType *)local_38);
    if (bVar1) {
      wasm::handle_unreachable
                ("TODO: gc data",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                 ,0xa0);
    }
    __assert_fail("heapType.isData()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x9f,"Literal fromBinaryenLiteral(BinaryenLiteral)");
  }
  switch(in_stack_00000008 & 0xffffffff) {
  case 0:
  case 1:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
               ,0x7f);
  case 2:
    (in_RDI->field_0).i32 = (int32_t)x.type;
    (in_RDI->type).id = 2;
    break;
  case 3:
    (in_RDI->field_0).i64 = x.type;
    (in_RDI->type).id = 3;
    break;
  case 4:
    local_38._0_4_ = (int32_t)x.type;
    wasm::Literal::castToF32(in_RDI,(Literal *)local_38);
    goto LAB_005b7083;
  case 5:
    local_38 = (undefined1  [8])x.type;
    wasm::Literal::castToF64(in_RDI,(Literal *)local_38);
LAB_005b7083:
    wasm::Literal::~Literal((Literal *)local_38);
    break;
  case 6:
    wasm::Literal::Literal(in_RDI,(uint8_t *)&x);
    break;
  default:
    goto switchD_005b6fbc_default;
  }
  return in_RDI;
}

Assistant:

Literal fromBinaryenLiteral(BinaryenLiteral x) {
  auto type = Type(x.type);
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(x.i32);
      case Type::i64:
        return Literal(x.i64);
      case Type::f32:
        return Literal(x.i32).castToF32();
      case Type::f64:
        return Literal(x.i64).castToF64();
      case Type::v128:
        return Literal(x.v128);
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  assert(type.isRef());
  auto heapType = type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic()) {
      case HeapType::i31:
        WASM_UNREACHABLE("TODO: i31");
      case HeapType::ext:
      case HeapType::any:
        WASM_UNREACHABLE("TODO: extern literals");
      case HeapType::eq:
      case HeapType::func:
      case HeapType::struct_:
      case HeapType::array:
        WASM_UNREACHABLE("invalid type");
      case HeapType::string:
      case HeapType::stringview_wtf8:
      case HeapType::stringview_wtf16:
      case HeapType::stringview_iter:
        WASM_UNREACHABLE("TODO: string literals");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
        assert(type.isNullable());
        return Literal::makeNull(heapType);
    }
  }
  if (heapType.isSignature()) {
    return Literal::makeFunc(Name(x.func), heapType);
  }
  assert(heapType.isData());
  WASM_UNREACHABLE("TODO: gc data");
}